

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O1

void Omega_h::choose_rails
               (Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_edge_codes,
               Reals *cand_edge_quals,Read<signed_char> *verts_are_cands,Reals *vert_quals,
               Read<long> *vert_rails)

{
  int *piVar1;
  LOs *pLVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Library *pLVar4;
  Alloc *pAVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  element_type *peVar10;
  Omega_h_Parting OVar11;
  LO LVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  element_type *peVar16;
  char cVar17;
  Int ent_dim;
  char *pcVar18;
  uint uVar19;
  long lVar20;
  element_type *peVar21;
  Alloc *pAVar22;
  Library *pLVar23;
  Write<long> vert_rails_w;
  Write<double> vert_quals_w;
  Write<signed_char> verts_are_cands_w;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  type f;
  Read<long> globals;
  Reals lengths;
  LOs ev2v;
  Adj v2e;
  Alloc *local_3e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3d8;
  LO local_3cc;
  undefined1 local_3c8 [32];
  Alloc *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  Alloc *local_398;
  element_type *local_390;
  Alloc *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  Alloc *local_378;
  element_type *local_370;
  Alloc *local_368;
  element_type *local_360;
  Alloc *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  Alloc *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  element_type *local_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  element_type *local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_320;
  Write<long> local_318;
  Write<double> local_308;
  Write<signed_char> local_2f8;
  Alloc *local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  Alloc *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  Alloc *local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  element_type *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  element_type *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  element_type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  element_type *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  LOs local_278;
  Alloc *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  Alloc *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  Alloc *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240;
  Alloc *local_238;
  element_type *local_230;
  Alloc *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  Alloc *local_218;
  element_type *local_210;
  Alloc *local_208;
  element_type *local_200;
  Alloc *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  Alloc *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  element_type *local_1d8;
  element_type *local_1d0;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  Write<long> local_1a8;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  Write<double> local_188;
  Alloc *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  Write<signed_char> local_168;
  Alloc *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  Alloc *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  Alloc *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  Alloc *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  Alloc *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  Alloc *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  Alloc *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  Alloc *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  Alloc *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Mesh *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  Adj local_60;
  
  local_2b8 = (element_type *)verts_are_cands;
  OVar11 = Mesh::parting(mesh);
  if (OVar11 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
         ,0x12);
  }
  local_278.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_278.write_.shared_alloc_.alloc & 7) == 0 &&
      local_278.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_278.write_.shared_alloc_.alloc =
           (Alloc *)((local_278.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_278.write_.shared_alloc_.alloc)->use_count =
           (local_278.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_278.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
  LVar12 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)&local_3e0,&local_278,LVar12);
  pAVar22 = local_278.write_.shared_alloc_.alloc;
  if (((ulong)local_278.write_.shared_alloc_.alloc & 7) == 0 &&
      local_278.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_278.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278.write_.shared_alloc_.alloc);
      operator_delete(pAVar22,0x48);
    }
  }
  Mesh::ask_up(&local_60,mesh,0,1);
  local_2c8 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2c8 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_2c0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_2d8 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d8 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_2d0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_2e8 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2e8 = (Alloc *)((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_2e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.codes.write_.shared_alloc_.direct_ptr;
  Mesh::ask_verts_of((Mesh *)&local_70,(Int)mesh);
  Mesh::ask_lengths((Mesh *)&local_148);
  Mesh::globals((Mesh *)&local_158,(Int)mesh);
  LVar12 = Mesh::nverts(mesh);
  pAVar22 = (Alloc *)(local_3c8 + 0x10);
  local_3c8._0_8_ = pAVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<signed_char>::Write(&local_2f8,LVar12,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar22) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  LVar12 = Mesh::nverts(mesh);
  local_3c8._0_8_ = pAVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<double>::Write(&local_308,LVar12,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar22) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  LVar12 = Mesh::nverts(mesh);
  local_3c8._0_8_ = pAVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
  Write<long>::Write(&local_318,LVar12,(string *)local_3c8);
  if ((Alloc *)local_3c8._0_8_ != pAVar22) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
  }
  peVar21 = local_2b8;
  local_268 = local_2c8;
  if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_268 = (Alloc *)(local_2c8->size * 8 + 1);
    }
    else {
      local_2c8->use_count = local_2c8->use_count + 1;
    }
  }
  local_260._M_pi = local_2c0._M_pi;
  local_258 = local_2d8;
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258 = (Alloc *)(local_2d8->size * 8 + 1);
    }
    else {
      local_2d8->use_count = local_2d8->use_count + 1;
    }
  }
  local_250._M_pi = local_2d0._M_pi;
  local_248 = local_3e0;
  if (((ulong)local_3e0 & 7) == 0 && local_3e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248 = (Alloc *)(local_3e0->size * 8 + 1);
    }
    else {
      local_3e0->use_count = local_3e0->use_count + 1;
    }
  }
  local_240._M_pi = local_3d8;
  local_238 = local_2e8;
  if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_238 = (Alloc *)(local_2e8->size * 8 + 1);
    }
    else {
      local_2e8->use_count = local_2e8->use_count + 1;
    }
  }
  local_230 = (element_type *)local_2e0._M_pi;
  local_228 = (cand_edge_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228 = (Alloc *)(local_228->size * 8 + 1);
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  local_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (cand_edge_codes->write_).shared_alloc_.direct_ptr;
  local_218 = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218 = (Alloc *)(local_158->size * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  local_210 = (element_type *)local_150._M_pi;
  local_208 = (Alloc *)local_148._M_pi;
  if (((ulong)local_148._M_pi & 7) == 0 && (Alloc *)local_148._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (Alloc *)((long)(local_148._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_148._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_148._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_200 = (element_type *)local_140._M_pi;
  local_1f8 = (cand_edge_quals->write_).shared_alloc_.alloc;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)(local_1f8->size * 8 + 1);
    }
    else {
      local_1f8->use_count = local_1f8->use_count + 1;
    }
  }
  local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (cand_edge_quals->write_).shared_alloc_.direct_ptr;
  local_1e8 = local_2f8.shared_alloc_.alloc;
  if (((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
      local_2f8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8 = (Alloc *)((local_2f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2f8.shared_alloc_.alloc)->use_count = (local_2f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.shared_alloc_.direct_ptr;
  local_1d8 = (element_type *)local_308.shared_alloc_.alloc;
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_308.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (element_type *)
                  ((long)(((CommPtr *)&(local_308.shared_alloc_.alloc)->size)->
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&(((LOs *)&(local_308.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.alloc =
           *(int *)&(((LOs *)&(local_308.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                    alloc + 1;
    }
  }
  local_1d0 = (element_type *)local_308.shared_alloc_.direct_ptr;
  local_1c8 = (element_type *)local_318.shared_alloc_.alloc;
  if (((ulong)local_318.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_318.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (element_type *)
                  ((long)(((CommPtr *)&(local_318.shared_alloc_.alloc)->size)->
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&(((LOs *)&(local_318.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.alloc =
           *(int *)&(((LOs *)&(local_318.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                    alloc + 1;
    }
  }
  local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318.shared_alloc_.direct_ptr;
  local_3cc = Mesh::nverts(mesh);
  local_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268;
  if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_268->size * 8 + 1);
    }
    else {
      local_268->use_count = local_268->use_count + 1;
    }
  }
  local_288 = (element_type *)local_260._M_pi;
  _Stack_130._M_pi = local_260._M_pi;
  local_128 = local_258;
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(local_258->size * 8 + 1);
    }
    else {
      local_258->use_count = local_258->use_count + 1;
    }
  }
  local_2a8 = (element_type *)local_250._M_pi;
  _Stack_120._M_pi = local_250._M_pi;
  local_118 = local_248;
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(local_248->size * 8 + 1);
    }
    else {
      local_248->use_count = local_248->use_count + 1;
    }
  }
  _Stack_110._M_pi = local_240._M_pi;
  local_108 = local_238;
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_238->size * 8 + 1);
    }
    else {
      local_238->use_count = local_238->use_count + 1;
    }
  }
  local_2b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230;
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230;
  local_f8 = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_228->size * 8 + 1);
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  _Stack_f0._M_pi = local_220;
  local_e8 = local_218;
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_218->size * 8 + 1);
    }
    else {
      local_218->use_count = local_218->use_count + 1;
    }
  }
  local_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210;
  local_d8 = local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_208->size * 8 + 1);
    }
    else {
      local_208->use_count = local_208->use_count + 1;
    }
  }
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200;
  local_c8 = local_1f8;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_1f8->size * 8 + 1);
    }
    else {
      local_1f8->use_count = local_1f8->use_count + 1;
    }
  }
  _Stack_c0._M_pi = local_1f0;
  local_b8 = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_1e8->size * 8 + 1);
    }
    else {
      local_1e8->use_count = local_1e8->use_count + 1;
    }
  }
  local_290._M_pi = local_1e0;
  _Stack_b0._M_pi = local_1e0;
  local_a8 = local_1d8;
  if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (element_type *)
                 ((long)(local_1d8->parent_comm_).
                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 + 1
                 );
    }
    else {
      *(int *)&local_1d8->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_1d8->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_298 = local_1d0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
  local_98 = local_1c8;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (element_type *)
                 ((long)(local_1c8->parent_comm_).
                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 + 1
                 );
    }
    else {
      *(int *)&local_1c8->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_1c8->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_2a0._M_pi = local_1c0;
  _Stack_90._M_pi = local_1c0;
  if (0 < local_3cc) {
    local_3c8._0_8_ = local_138._M_pi;
    local_3c8._8_8_ = local_260._M_pi;
    if (((ulong)local_138._M_pi & 7) == 0 && (Alloc *)local_138._M_pi != (Alloc *)0x0) {
      *(int *)&local_138._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_138._M_pi[3]._vptr__Sp_counted_base + -1;
      local_3c8._0_8_ = (long)(local_138._M_pi)->_vptr__Sp_counted_base * 8 + 1;
    }
    local_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_3c8._16_8_ = local_128;
    local_3c8._24_8_ = local_250._M_pi;
    if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
      local_128->use_count = local_128->use_count + -1;
      local_3c8._16_8_ = local_128->size * 8 + 1;
    }
    local_128 = (Alloc *)0x0;
    _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_3a8 = local_118;
    local_3a0 = local_240._M_pi;
    if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
      local_118->use_count = local_118->use_count + -1;
      local_3a8 = (Alloc *)(local_118->size * 8 + 1);
    }
    local_118 = (Alloc *)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_398 = local_108;
    local_390 = local_230;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_398 = (Alloc *)(local_108->size * 8 + 1);
    }
    local_108 = (Alloc *)0x0;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_388 = local_f8;
    local_380 = local_220;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      local_f8->use_count = local_f8->use_count + -1;
      local_388 = (Alloc *)(local_f8->size * 8 + 1);
    }
    local_f8 = (Alloc *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_378 = local_e8;
    local_370 = local_210;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_378 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_368 = local_d8;
    local_360 = local_200;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_368 = (Alloc *)(local_d8->size * 8 + 1);
    }
    local_d8 = (Alloc *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_358 = local_c8;
    local_350 = local_1f0;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_358 = (Alloc *)(local_c8->size * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_348 = local_b8;
    local_340 = local_1e0;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_348 = (Alloc *)(local_b8->size * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_338 = local_a8;
    local_330._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (element_type *)0x0) {
      *(int *)&local_a8->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_a8->items2content_[0].write_.shared_alloc_.alloc + -1;
      local_338 = (element_type *)
                  ((long)(local_a8->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    local_a8 = (element_type *)0x0;
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_328 = local_98;
    local_320._M_pi = local_1c0;
    if (((ulong)local_98 & 7) == 0 && local_98 != (element_type *)0x0) {
      *(int *)&local_98->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_98->items2content_[0].write_.shared_alloc_.alloc + -1;
      local_328 = (element_type *)
                  ((long)(local_98->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    local_98 = (element_type *)0x0;
    _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    lVar20 = 0;
    do {
      iVar7 = *(int *)((long)&(((Graph *)&(local_260._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                              shared_alloc_.alloc + lVar20 * 4);
      iVar8 = *(int *)((long)&(((Graph *)&(local_260._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                              shared_alloc_.alloc + lVar20 * 4 + 4);
      local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals;
      local_78 = mesh;
      if (iVar7 < iVar8) {
        peVar16 = (element_type *)0xffffffffffffffff;
        lVar13 = 0;
        cVar17 = '\0';
        pLVar23 = (Library *)0xbff0000000000000;
        pAVar22 = (Alloc *)0xbff0000000000000;
        do {
          lVar14 = (long)*(int *)((long)&(((Graph *)&(local_250._M_pi)->_vptr__Sp_counted_base)->
                                         a2ab).write_.shared_alloc_.alloc +
                                 lVar13 * 4 + (long)iVar7 * 4);
          iVar9 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    *)&(local_240._M_pi)->_vptr__Sp_counted_base)->_M_ptr +
                          lVar14 * 4);
          if ((long)iVar9 != -1) {
            cVar6 = *(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                       *)&local_220->_vptr__Sp_counted_base)->_M_ptr + (long)iVar9);
            if (cVar6 == '\0') {
              uVar15 = 0x2a;
              pcVar18 = "cand_code != DONT_COLLAPSE";
              goto LAB_00266533;
            }
            uVar19 = (uint)(*(char *)((long)&(local_230->super_Graph).a2ab.write_.shared_alloc_.
                                             alloc + lVar13 + iVar7) >> 3);
            if (((uint)(int)cVar6 >> (uVar19 & 0x1f) & 1) != 0) {
              pLVar4 = (&local_200->library_)[lVar14];
              pAVar5 = (Alloc *)(&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    *)&local_1f0->_vptr__Sp_counted_base)->_M_ptr)
                                [(int)(uVar19 + iVar9 * 2)];
              if ((peVar16 != (element_type *)0xffffffffffffffff) &&
                 ((double)pLVar23 <= (double)pLVar4)) {
                if (((double)pLVar4 != (double)pLVar23) ||
                   ((NAN((double)pLVar4) || NAN((double)pLVar23) ||
                    ((double)pAVar5 <= (double)pAVar22)))) goto LAB_00265c3f;
              }
              cVar17 = '\x01';
              peVar16 = (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                          &local_210->library_)->_M_ptr)[lVar14];
              pAVar22 = pAVar5;
              pLVar23 = pLVar4;
            }
          }
LAB_00265c3f:
          lVar13 = lVar13 + 1;
        } while (iVar8 - iVar7 != (int)lVar13);
      }
      else {
        peVar16 = (element_type *)0xffffffffffffffff;
        cVar17 = '\0';
        pAVar22 = (Alloc *)0xbff0000000000000;
      }
      *(char *)((long)&local_1e0->_vptr__Sp_counted_base + lVar20) = cVar17;
      if ((cVar17 != '\0') && (peVar16 == (element_type *)0xffffffffffffffff)) {
        uVar15 = 0x38;
        pcVar18 = "best_global != -1";
LAB_00266533:
        fail("assertion %s failed at %s +%d\n",pcVar18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
             ,uVar15);
      }
      (&(local_1d0->super_Graph).a2ab.write_.shared_alloc_.alloc)[lVar20] = pAVar22;
      (&local_1c0->_vptr__Sp_counted_base)[lVar20] = (_func_int **)peVar16;
      lVar20 = lVar20 + 1;
    } while (local_3cc != (int)lVar20);
    choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
    ::$_0::~__0((__0 *)local_3c8);
    vert_quals = (Reals *)local_80._M_pi;
    mesh = local_78;
    peVar21 = local_2b8;
  }
  choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
  ::$_0::~__0((__0 *)&local_138);
  local_168.shared_alloc_.alloc = local_2f8.shared_alloc_.alloc;
  if (((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
      local_2f8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.shared_alloc_.alloc = (Alloc *)((local_2f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2f8.shared_alloc_.alloc)->use_count = (local_2f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_168.shared_alloc_.direct_ptr = local_2f8.shared_alloc_.direct_ptr;
  Read<signed_char>::Read((Read<signed_char> *)local_3c8,&local_168);
  pAVar22 = ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc;
  if (((ulong)pAVar22 & 7) == 0 && pAVar22 != (Alloc *)0x0) {
    piVar1 = &pAVar22->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar22);
      operator_delete(pAVar22,0x48);
    }
  }
  ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc = (Alloc *)local_3c8._0_8_;
  ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->direct_ptr = (void *)local_3c8._8_8_;
  if (((local_3c8._0_8_ & 7) == 0 && (Alloc *)local_3c8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_3c8._0_8_ + 0x30) = *(int *)(local_3c8._0_8_ + 0x30) + -1;
    ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc =
         (Alloc *)(*(long *)local_3c8._0_8_ * 8 + 1);
  }
  pAVar22 = local_168.shared_alloc_.alloc;
  local_3c8._0_8_ = (Alloc *)0x0;
  local_3c8._8_8_ = (element_type *)0x0;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.shared_alloc_.alloc);
      operator_delete(pAVar22,0x48);
    }
  }
  local_178 = ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_170._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->direct_ptr;
  ent_dim = (Int)mesh;
  Mesh::sync_array<signed_char>((Mesh *)local_3c8,ent_dim,(Read<signed_char> *)0x0,(Int)&local_178);
  pAVar22 = ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc;
  if (((ulong)pAVar22 & 7) == 0 && pAVar22 != (Alloc *)0x0) {
    piVar1 = &pAVar22->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar22);
      operator_delete(pAVar22,0x48);
    }
  }
  pAVar22 = local_178;
  ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc = (Alloc *)local_3c8._0_8_;
  ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->direct_ptr = (void *)local_3c8._8_8_;
  if (((local_3c8._0_8_ & 7) == 0 && (Alloc *)local_3c8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_3c8._0_8_ + 0x30) = *(int *)(local_3c8._0_8_ + 0x30) + -1;
    ((SharedAlloc *)&(peVar21->super_Graph).a2ab)->alloc =
         (Alloc *)(*(long *)local_3c8._0_8_ * 8 + 1);
  }
  local_3c8._0_8_ = (Alloc *)0x0;
  local_3c8._8_8_ = (element_type *)0x0;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    piVar1 = &local_178->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178);
      operator_delete(pAVar22,0x48);
    }
  }
  local_188.shared_alloc_.alloc = local_308.shared_alloc_.alloc;
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_308.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_188.shared_alloc_.alloc =
           (Alloc *)((long)(((CommPtr *)&(local_308.shared_alloc_.alloc)->size)->
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8
                    + 1);
    }
    else {
      *(int *)&(((LOs *)&(local_308.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.alloc =
           *(int *)&(((LOs *)&(local_308.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                    alloc + 1;
    }
  }
  local_188.shared_alloc_.direct_ptr = local_308.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_3c8,&local_188);
  pAVar22 = (((Write<double> *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base)
            ->shared_alloc_).alloc;
  if (((ulong)pAVar22 & 7) == 0 && pAVar22 != (Alloc *)0x0) {
    piVar1 = &pAVar22->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar22);
      operator_delete(pAVar22,0x48);
    }
  }
  pAVar22 = local_188.shared_alloc_.alloc;
  (((Write<double> *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base)->
  shared_alloc_).alloc = (Alloc *)local_3c8._0_8_;
  *(undefined8 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_M_use_count =
       local_3c8._8_8_;
  if (((local_3c8._0_8_ & 7) == 0 && (Alloc *)local_3c8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_3c8._0_8_ + 0x30) = *(int *)(local_3c8._0_8_ + 0x30) + -1;
    (((Write<double> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base)->
    shared_alloc_).alloc = (Alloc *)(*(long *)local_3c8._0_8_ * 8 + 1);
  }
  local_3c8._0_8_ = (Alloc *)0x0;
  local_3c8._8_8_ = (element_type *)0x0;
  if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_188.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar2 = (LOs *)&(local_188.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar2->write_).shared_alloc_.alloc =
         *(int *)&(pLVar2->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar2->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_188.shared_alloc_.alloc);
      operator_delete(pAVar22,0x48);
    }
  }
  local_198 = (element_type *)
              (((Write<double> *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base
               )->shared_alloc_).alloc;
  if (((ulong)local_198 & 7) == 0 && local_198 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (element_type *)
                  ((long)(local_198->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_198->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_198->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_190._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_M_use_count;
  Mesh::sync_array<double>((Mesh *)local_3c8,ent_dim,(Read<double> *)0x0,(Int)&local_198);
  pAVar22 = (((Write<double> *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base)
            ->shared_alloc_).alloc;
  if (((ulong)pAVar22 & 7) == 0 && pAVar22 != (Alloc *)0x0) {
    piVar1 = &pAVar22->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar22);
      operator_delete(pAVar22,0x48);
    }
  }
  peVar10 = local_198;
  (((Write<double> *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base)->
  shared_alloc_).alloc = (Alloc *)local_3c8._0_8_;
  *(undefined8 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_M_use_count =
       local_3c8._8_8_;
  if (((local_3c8._0_8_ & 7) == 0 && (Alloc *)local_3c8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_3c8._0_8_ + 0x30) = *(int *)(local_3c8._0_8_ + 0x30) + -1;
    (((Write<double> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vert_quals)->_vptr__Sp_counted_base)->
    shared_alloc_).alloc = (Alloc *)(*(long *)local_3c8._0_8_ * 8 + 1);
  }
  local_3c8._0_8_ = (Alloc *)0x0;
  local_3c8._8_8_ = (element_type *)0x0;
  if (((ulong)local_198 & 7) == 0 && local_198 != (element_type *)0x0) {
    pLVar2 = local_198->items2content_;
    *(int *)&(pLVar2->write_).shared_alloc_.alloc =
         *(int *)&(pLVar2->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar2->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc((Alloc *)local_198);
      operator_delete(peVar10,0x48);
    }
  }
  local_1a8.shared_alloc_.alloc = local_318.shared_alloc_.alloc;
  if (((ulong)local_318.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_318.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.shared_alloc_.alloc =
           (Alloc *)((long)(((CommPtr *)&(local_318.shared_alloc_.alloc)->size)->
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8
                    + 1);
    }
    else {
      *(int *)&(((LOs *)&(local_318.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.alloc =
           *(int *)&(((LOs *)&(local_318.shared_alloc_.alloc)->use_count)->write_).shared_alloc_.
                    alloc + 1;
    }
  }
  local_1a8.shared_alloc_.direct_ptr = local_318.shared_alloc_.direct_ptr;
  Read<long>::Read((Read<signed_char> *)local_3c8,&local_1a8);
  pAVar22 = (vert_rails->write_).shared_alloc_.alloc;
  if (((ulong)pAVar22 & 7) == 0 && pAVar22 != (Alloc *)0x0) {
    piVar1 = &pAVar22->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar22);
      operator_delete(pAVar22,0x48);
    }
  }
  pAVar22 = local_1a8.shared_alloc_.alloc;
  (vert_rails->write_).shared_alloc_.alloc = (Alloc *)local_3c8._0_8_;
  (vert_rails->write_).shared_alloc_.direct_ptr = (void *)local_3c8._8_8_;
  if (((local_3c8._0_8_ & 7) == 0 && (Alloc *)local_3c8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_3c8._0_8_ + 0x30) = *(int *)(local_3c8._0_8_ + 0x30) + -1;
    (vert_rails->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_3c8._0_8_ * 8 + 1);
  }
  local_3c8._0_8_ = (Alloc *)0x0;
  local_3c8._8_8_ = (element_type *)0x0;
  if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_1a8.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar2 = (LOs *)&(local_1a8.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar2->write_).shared_alloc_.alloc =
         *(int *)&(pLVar2->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar2->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_1a8.shared_alloc_.alloc);
      operator_delete(pAVar22,0x48);
    }
  }
  local_1b8 = (element_type *)(vert_rails->write_).shared_alloc_.alloc;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (element_type *)
                  ((long)(local_1b8->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_1b8->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_1b8->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_1b0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(vert_rails->write_).shared_alloc_.direct_ptr
  ;
  Mesh::sync_array<long>((Mesh *)local_3c8,ent_dim,(Read<long> *)0x0,(Int)&local_1b8);
  pAVar22 = (vert_rails->write_).shared_alloc_.alloc;
  if (((ulong)pAVar22 & 7) == 0 && pAVar22 != (Alloc *)0x0) {
    piVar1 = &pAVar22->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar22);
      operator_delete(pAVar22,0x48);
    }
  }
  peVar10 = local_1b8;
  (vert_rails->write_).shared_alloc_.alloc = (Alloc *)local_3c8._0_8_;
  (vert_rails->write_).shared_alloc_.direct_ptr = (void *)local_3c8._8_8_;
  if (((local_3c8._0_8_ & 7) == 0 && (Alloc *)local_3c8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_3c8._0_8_ + 0x30) = *(int *)(local_3c8._0_8_ + 0x30) + -1;
    (vert_rails->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_3c8._0_8_ * 8 + 1);
  }
  local_3c8._0_8_ = (pointer)0x0;
  local_3c8._8_8_ = (element_type *)0x0;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
    pLVar2 = local_1b8->items2content_;
    *(int *)&(pLVar2->write_).shared_alloc_.alloc =
         *(int *)&(pLVar2->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar2->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc((Alloc *)local_1b8);
      operator_delete(peVar10,0x48);
    }
  }
  choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
  ::$_0::~__0((__0 *)&local_268);
  if (((ulong)local_318.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_318.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar2 = (LOs *)&(local_318.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar2->write_).shared_alloc_.alloc =
         *(int *)&(pLVar2->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar2->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_318.shared_alloc_.alloc);
      operator_delete(local_318.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_308.shared_alloc_.alloc != (element_type *)0x0) {
    pLVar2 = (LOs *)&(local_308.shared_alloc_.alloc)->use_count;
    *(int *)&(pLVar2->write_).shared_alloc_.alloc =
         *(int *)&(pLVar2->write_).shared_alloc_.alloc + -1;
    if (*(int *)&(pLVar2->write_).shared_alloc_.alloc == 0) {
      Alloc::~Alloc(local_308.shared_alloc_.alloc);
      operator_delete(local_308.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
      local_2f8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2f8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2f8.shared_alloc_.alloc);
      operator_delete(local_2f8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    piVar1 = &local_158->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158);
      operator_delete(local_158,0x48);
    }
  }
  if (((ulong)local_148._M_pi & 7) == 0 && (Alloc *)local_148._M_pi != (Alloc *)0x0) {
    p_Var3 = local_148._M_pi + 3;
    *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_148._M_pi);
      operator_delete(local_148._M_pi,0x48);
    }
  }
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    p_Var3 = local_70._M_pi + 3;
    *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_70._M_pi);
      operator_delete(local_70._M_pi,0x48);
    }
  }
  pAVar22 = local_2e8;
  if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
    piVar1 = &local_2e8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2e8);
      operator_delete(pAVar22,0x48);
    }
  }
  pAVar22 = local_2d8;
  if (((ulong)local_2d8 & 7) == 0 && local_2d8 != (Alloc *)0x0) {
    piVar1 = &local_2d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2d8);
      operator_delete(pAVar22,0x48);
    }
  }
  pAVar22 = local_2c8;
  if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
    piVar1 = &local_2c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2c8);
      operator_delete(pAVar22,0x48);
    }
  }
  Adj::~Adj(&local_60);
  if (((ulong)local_3e0 & 7) == 0 && local_3e0 != (Alloc *)0x0) {
    piVar1 = &local_3e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_3e0);
      operator_delete(local_3e0,0x48);
    }
  }
  return;
}

Assistant:

void choose_rails(Mesh* mesh, LOs cands2edges, Read<I8> cand_edge_codes,
    Reals cand_edge_quals, Read<I8>* verts_are_cands, Reals* vert_quals,
    Read<GO>* vert_rails) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto edges2cands = invert_injective_map(cands2edges, mesh->nedges());
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto lengths = mesh->ask_lengths();
  auto globals = mesh->globals(EDGE);
  auto verts_are_cands_w = Write<I8>(mesh->nverts());
  auto vert_quals_w = Write<Real>(mesh->nverts());
  auto vert_rails_w = Write<GO>(mesh->nverts());
  auto f = OMEGA_H_LAMBDA(LO v) {
    bool vert_is_cand = false;
    GO best_global = -1;
    Real best_length = -1;
    Real best_qual = -1;
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto cand = edges2cands[e];
      if (cand == -1) continue;
      auto ve_code = ve_codes[ve];
      auto eev = code_which_down(ve_code);
      auto cand_code = cand_edge_codes[cand];
      OMEGA_H_CHECK(cand_code != DONT_COLLAPSE);
      if (!collapses(cand_code, eev)) continue;
      auto global = globals[e];
      auto length = lengths[e];
      auto qual = cand_edge_quals[cand * 2 + eev];
      if ((best_global == -1) || (length < best_length) ||
          ((length == best_length) && (qual > best_qual))) {
        vert_is_cand = true;
        best_global = global;
        best_length = length;
        best_qual = qual;
      }
    }
    verts_are_cands_w[v] = vert_is_cand;
    if (vert_is_cand) OMEGA_H_CHECK(best_global != -1);
    vert_quals_w[v] = best_qual;
    vert_rails_w[v] = best_global;
  };
  parallel_for(mesh->nverts(), f, "choose_rails");
  *verts_are_cands = verts_are_cands_w;
  *verts_are_cands = mesh->sync_array(VERT, *verts_are_cands, 1);
  *vert_quals = vert_quals_w;
  *vert_quals = mesh->sync_array(VERT, *vert_quals, 1);
  *vert_rails = vert_rails_w;
  *vert_rails = mesh->sync_array(VERT, *vert_rails, 1);
}